

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O0

void __thiscall Net::fit(Net *this,Table *samp,Table *ans,int global_iterations,int shott)

{
  int col;
  int iVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  double *pdVar5;
  ulong uVar6;
  reference pvVar7;
  int *piVar8;
  double dVar9;
  double dVar10;
  int local_13e8;
  int local_13e4;
  int *local_13e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_13d8;
  int local_13cc;
  double dStack_13c8;
  int i_1;
  double local_13c0;
  int local_13b4;
  undefined1 local_13b0 [4];
  int i;
  mt19937 rnd;
  int shott_local;
  int global_iterations_local;
  Table *ans_local;
  Table *samp_local;
  Net *this_local;
  
  this->shot = shott;
  rnd._M_p._0_4_ = shott;
  rnd._M_p._4_4_ = global_iterations;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_13b0,0x4b);
  iVar1 = Table::get_cols(ans);
  if (iVar1 != 1) {
    std::operator<<((ostream *)&std::cerr,"Output table has more than 1 column\n");
    exit(1);
  }
  iVar1 = Table::get_cols(samp);
  pvVar3 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->mesh,0);
  sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
  if ((long)iVar1 != sVar4) {
    std::operator<<((ostream *)&std::cerr,"Incorrect input data\n");
    exit(1);
  }
  dVar9 = Table::get_max(ans,0);
  dVar10 = Table::get_min(ans,0);
  pvVar3 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::back(&this->mesh);
  sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
  if ((int)((dVar9 - dVar10) + 1.0) != (int)sVar4) {
    std::operator<<((ostream *)&std::cerr,"Incorrect output data\n");
    exit(1);
  }
  Table::operator=(&this->samples,samp);
  Table::operator=(&this->answers,ans);
  local_13b4 = 0;
  while( true ) {
    iVar1 = local_13b4;
    iVar2 = Table::get_cols(&this->samples);
    col = local_13b4;
    if (iVar2 <= iVar1) break;
    local_13c0 = 1.0;
    dStack_13c8 = Table::get_max(&this->samples,local_13b4);
    pdVar5 = std::max<double>(&local_13c0,&stack0xffffffffffffec38);
    Table::divide_column(&this->samples,col,*pdVar5);
    local_13b4 = local_13b4 + 1;
  }
  iVar1 = Table::get_rows(&this->samples);
  std::vector<int,_std::allocator<int>_>::resize(&this->shuffler,(long)iVar1);
  local_13cc = 0;
  while( true ) {
    uVar6 = (ulong)local_13cc;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->shuffler);
    iVar1 = local_13cc;
    if (sVar4 <= uVar6) break;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->shuffler,(long)local_13cc);
    *pvVar7 = iVar1;
    local_13cc = local_13cc + 1;
  }
  local_13d8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->shuffler);
  local_13e0 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->shuffler);
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (local_13d8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_13e0,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_13b0);
  if (this->shot == 0) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->shuffler);
    dVar9 = log((double)(int)sVar4);
    local_13e4 = (int)dVar9 / 10;
    local_13e8 = 2;
    piVar8 = std::max<int>(&local_13e4,&local_13e8);
    this->shot = *piVar8;
  }
  learn(this,rnd._M_p._4_4_);
  return;
}

Assistant:

void Net::fit(Table &samp, Table &ans, int global_iterations, int shott){
    shot = shott;
    std::mt19937 rnd(75);
    if (ans.get_cols() != 1){
        std::cerr << "Output table has more than 1 column\n";
        exit(EXIT_FAILURE);
    }
    if (samp.get_cols() != mesh[0].size()){
        std::cerr << "Incorrect input data\n";
        exit(EXIT_FAILURE);
    }
    if ((int)(ans.get_max(0)-ans.get_min(0) + 1) != (int)mesh.back().size()){
        std::cerr << "Incorrect output data\n";
        exit(EXIT_FAILURE);
    }

    samples = samp;
    answers = ans;
    for (int i = 0; i < samples.get_cols(); ++i)
        samples.divide_column(i, std::max(1.0, samples.get_max(i)));

    // creating shuffler
    shuffler.resize(samples.get_rows());
    for (int i = 0; i < shuffler.size(); ++i)
        shuffler[i] = i;
    std::shuffle(shuffler.begin(), shuffler.end(), rnd);
    if (shot == 0) shot = std::max((int)log((int)shuffler.size())/10, 2);
    learn(global_iterations);
}